

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalSubsumption.cpp
# Opt level: O3

bool __thiscall
Inferences::GlobalSubsumption::perform
          (GlobalSubsumption *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  int *piVar1;
  Unit **ppUVar2;
  Unit **ppUVar3;
  Clause *pCVar4;
  VirtualIterator<Kernel::Clause_*> local_28;
  
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::prems ==
      '\0') {
    perform();
  }
  pCVar4 = perform(this,cl,&perform::prems);
  ppUVar3 = perform::prems._cursor;
  ppUVar2 = perform::prems._stack;
  if (pCVar4 != cl) {
    *replacement = pCVar4;
    local_28._core =
         (IteratorCore<Kernel::Clause_*> *)
         Lib::FixedSizeAllocator<48UL>::alloc
                   ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    (local_28._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b39060;
    *(Unit ***)&local_28._core[1]._refCnt = ppUVar2;
    local_28._core[2]._vptr_IteratorCore = (_func_int **)ppUVar3;
    (local_28._core)->_refCnt = 1;
    Lib::VirtualIterator<Kernel::Clause_*>::operator=(premises,&local_28);
    if (local_28._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar1 = &(local_28._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_28._core)->_vptr_IteratorCore[1])();
      }
    }
  }
  return pCVar4 != cl;
}

Assistant:

bool GlobalSubsumption::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  static Stack<Unit*> prems;

  Clause* newCl = perform(cl,prems);
  if(newCl==cl) {
    return false;
  }

  Stack<Unit*>::BottomFirstIterator it(prems);

  replacement = newCl;
  premises = pvi( getMappingIterator(it, Unit2ClFn()) );
  return true;
}